

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

bool jsonip::parser::
     seq_<jsonip::grammar::spaces_,jsonip::parser::or_<jsonip::parser::seq_<jsonip::grammar::member_,jsonip::parser::star_<jsonip::parser::seq_<jsonip::grammar::spaces_,jsonip::parser::comma,jsonip::grammar::spaces_,jsonip::grammar::member_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>,jsonip::parser::identity<true>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>,jsonip::grammar::spaces_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *state)

{
  pointer *ppSVar1;
  iterator __position;
  bool bVar2;
  pointer pSVar3;
  undefined1 auVar4 [16];
  undefined1 auStack_28 [8];
  State cur_state;
  
  auVar4 = std::istream::tellg();
  cur_state._0_8_ = auVar4._8_8_;
  auStack_28 = auVar4._0_8_;
  cur_state._8_8_ = state->line_;
  __position._M_current =
       (state->stack_).
       super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State>>
    ::
    _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State_const&>
              ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State>>
                *)&state->stack_,__position,(State *)auStack_28);
    auVar4._8_8_ = cur_state._0_8_;
    auVar4._0_8_ = auStack_28;
  }
  else {
    (__position._M_current)->line_ = cur_state._8_8_;
    (__position._M_current)->pos_ = (PositionType)auVar4[0];
    *(long *)&(__position._M_current)->field_0x1 = auVar4._1_8_;
    *(int7 *)&(__position._M_current)->field_0x9 = auVar4._9_7_;
    ppSVar1 = &(state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  cur_state._0_8_ = auVar4._8_8_;
  auStack_28 = auVar4._0_8_;
  bVar2 = star_<jsonip::grammar::space>::
          match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                    (state);
  if (bVar2) {
    bVar2 = or_<jsonip::parser::seq_<jsonip::grammar::member_,jsonip::parser::star_<jsonip::parser::seq_<jsonip::grammar::spaces_,jsonip::parser::comma,jsonip::grammar::spaces_,jsonip::grammar::member_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>,jsonip::parser::identity<true>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
            ::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                      (state);
    if (bVar2) {
      bVar2 = star_<jsonip::grammar::space>::
              match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                        (state);
      if (bVar2) {
        auVar4 = std::istream::tellg();
        if (*(long *)&state->max_pos_ < auVar4._0_8_) {
          state->max_pos_ = (PositionType)auVar4[0];
          *(long *)&state->field_0x29 = auVar4._1_8_;
          *(int7 *)&state->field_0x31 = auVar4._9_7_;
        }
        pSVar3 = (state->stack_).
                 super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar2 = true;
        goto LAB_001143dd;
      }
    }
  }
  auVar4 = std::istream::tellg();
  if (*(long *)&state->max_pos_ < auVar4._0_8_) {
    state->max_pos_ = (PositionType)auVar4[0];
    *(long *)&state->field_0x29 = auVar4._1_8_;
    *(int7 *)&state->field_0x31 = auVar4._9_7_;
  }
  pSVar3 = (state->stack_).
           super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::istream::seekg(state->reader_->in_,*(undefined8 *)(pSVar3 + -1),
                      *(undefined8 *)&pSVar3[-1].field_0x8);
  pSVar3 = (state->stack_).
           super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  state->line_ = pSVar3[-1].line_;
  bVar2 = false;
LAB_001143dd:
  (state->stack_).
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar3 + -1;
  return bVar2;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = C0::match(state) && C1::match(state) &&
                       C2::match(state) && C3::match(state) &&
                       C4::match(state) && C5::match(state) &&
                       C6::match(state) && C7::match(state);
            var ? state.commit() : state.rollback();

            return var;
        }